

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O0

vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_1::FilterCase::genFilters
          (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
           *__return_storage_ptr__,FilterCase *this,
          vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
          *messages,
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          *initial,deUint32 seed,int iterations)

{
  size_t *psVar1;
  allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID> *this_00;
  allocator<unsigned_int> *paVar2;
  GLenum GVar3;
  GLenum type_;
  bool bVar4;
  deUint32 dVar5;
  int iVar6;
  char *str;
  size_type sVar7;
  const_reference __x;
  iterator __first;
  iterator __last;
  iterator iVar8;
  iterator iVar9;
  const_reference pvVar10;
  GLuint *__value;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar11;
  allocator<unsigned_int> local_379;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_378;
  MessageFilter local_360;
  byte local_329;
  const_reference pvStack_328;
  bool enabled_3;
  MessageID *id;
  int itr;
  int start;
  pointer puStack_310;
  pointer local_308;
  MessageFilter local_300;
  byte local_2cd;
  GLenum local_2cc;
  undefined1 auStack_2c8 [3];
  bool enabled_2;
  GLenum severity;
  pointer puStack_2c0;
  pointer local_2b8;
  MessageFilter local_2b0;
  byte local_27d;
  GLenum local_27c;
  undefined1 auStack_278 [3];
  bool enabled_1;
  GLenum type;
  pointer puStack_270;
  pointer local_268;
  MessageFilter local_258;
  byte local_225;
  GLenum local_224;
  int iStack_220;
  bool enabled;
  GLenum source;
  int iteration;
  _Rb_tree_const_iterator<unsigned_int> local_210;
  undefined1 local_208 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> severities;
  undefined1 local_1d8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> types;
  undefined1 local_1a8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> sources;
  undefined1 local_178 [8];
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
  messageIds;
  MessageData *msg;
  int ndx;
  undefined1 local_100 [8];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> tempSeverities;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> tempTypes;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> tempSources;
  set<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
  tempMessageIds;
  Random rng;
  int iterations_local;
  deUint32 seed_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *initial_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  *messages_local;
  FilterCase *this_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  *filters;
  
  str = tcu::TestNode::getName((TestNode *)this);
  dVar5 = deStringHash(str);
  dVar5 = ::deInt32Hash(dVar5);
  de::Random::Random((Random *)&tempMessageIds._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     seed ^ dVar5);
  std::
  set<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
  ::set((set<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
         *)&tempSources._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &tempTypes._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &tempSeverities._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_100)
  ;
  bVar4 = std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
          ::empty(messages);
  if (bVar4) {
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::vector(__return_storage_ptr__,initial);
  }
  else {
    for (msg._4_4_ = 0;
        sVar7 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
                ::size(messages), msg._4_4_ < (int)sVar7; msg._4_4_ = msg._4_4_ + 1) {
      __x = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
            ::operator[](messages,(long)msg._4_4_);
      std::
      set<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
      ::insert((set<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
                *)&tempSources._M_t._M_impl.super__Rb_tree_header._M_node_count,&__x->id);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &tempTypes._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (value_type_conflict4 *)__x);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &tempSeverities._M_t._M_impl.super__Rb_tree_header._M_node_count,&(__x->id).type);
      pVar11 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
               insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      local_100,&__x->severity);
      messageIds.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pVar11.first._M_node;
    }
    psVar1 = &tempSources._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __first = std::
              set<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
              ::begin((set<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
                       *)psVar1);
    __last = std::
             set<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
             ::end((set<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
                    *)psVar1);
    this_00 = (allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID> *)
              ((long)&sources.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>::allocator(this_00);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageID,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>>
    ::
    vector<std::_Rb_tree_const_iterator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,void>
              ((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageID,std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>>
                *)local_178,
               (_Rb_tree_const_iterator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>)
               __first._M_node,
               (_Rb_tree_const_iterator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>)
               __last._M_node,this_00);
    std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>::~allocator
              ((allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID> *)
               ((long)&sources.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    psVar1 = &tempTypes._M_t._M_impl.super__Rb_tree_header._M_node_count;
    iVar8 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       psVar1);
    iVar9 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       psVar1);
    paVar2 = (allocator<unsigned_int> *)
             ((long)&types.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_int>::allocator(paVar2);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_1a8,
               (_Rb_tree_const_iterator<unsigned_int>)iVar8._M_node,
               (_Rb_tree_const_iterator<unsigned_int>)iVar9._M_node,paVar2);
    std::allocator<unsigned_int>::~allocator
              ((allocator<unsigned_int> *)
               ((long)&types.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    psVar1 = &tempSeverities._M_t._M_impl.super__Rb_tree_header._M_node_count;
    iVar8 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       psVar1);
    iVar9 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       psVar1);
    paVar2 = (allocator<unsigned_int> *)
             ((long)&severities.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_int>::allocator(paVar2);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_1d8,
               (_Rb_tree_const_iterator<unsigned_int>)iVar8._M_node,
               (_Rb_tree_const_iterator<unsigned_int>)iVar9._M_node,paVar2);
    std::allocator<unsigned_int>::~allocator
              ((allocator<unsigned_int> *)
               ((long)&severities.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_210._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                   ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    local_100);
    _iteration = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                           ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)local_100);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&source + 3));
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_208,local_210,
               (_Rb_tree_const_iterator<unsigned_int>)_iteration,
               (allocator<unsigned_int> *)((long)&source + 3));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&source + 3));
    source._2_1_ = 0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::vector(__return_storage_ptr__,initial);
    for (iStack_220 = 0; iStack_220 < iterations; iStack_220 = iStack_220 + 1) {
      iVar6 = de::Random::getInt((Random *)
                                 &tempMessageIds._M_t._M_impl.super__Rb_tree_header._M_node_count,0,
                                 8);
      if (iVar6 == 0) {
        sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1a8);
        iVar6 = de::Random::getInt((Random *)
                                   &tempMessageIds._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                   0,(int)sVar7 + -1);
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1a8,
                             (long)iVar6);
        local_224 = *pvVar10;
        local_225 = de::Random::getBool((Random *)
                                        &tempMessageIds._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count);
        GVar3 = local_224;
        _auStack_278 = (pointer)0x0;
        puStack_270 = (pointer)0x0;
        local_268 = (pointer)0x0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_278);
        MessageFilter::MessageFilter
                  (&local_258,GVar3,0x1100,0x1100,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_278,
                   (bool)(local_225 & 1));
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
        ::push_back(__return_storage_ptr__,&local_258);
        MessageFilter::~MessageFilter(&local_258);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_278);
      }
      else if (iVar6 == 1) {
        dVar5 = de::Random::getUint32
                          ((Random *)
                           &tempMessageIds._M_t._M_impl.super__Rb_tree_header._M_node_count);
        sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8);
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8,
                             (ulong)dVar5 % sVar7);
        local_27c = *pvVar10;
        local_27d = de::Random::getBool((Random *)
                                        &tempMessageIds._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count);
        GVar3 = local_27c;
        _auStack_2c8 = (pointer)0x0;
        puStack_2c0 = (pointer)0x0;
        local_2b8 = (pointer)0x0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_2c8);
        MessageFilter::MessageFilter
                  (&local_2b0,0x1100,GVar3,0x1100,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_2c8,
                   (bool)(local_27d & 1));
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
        ::push_back(__return_storage_ptr__,&local_2b0);
        MessageFilter::~MessageFilter(&local_2b0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_2c8);
      }
      else if (iVar6 == 2) {
        dVar5 = de::Random::getUint32
                          ((Random *)
                           &tempMessageIds._M_t._M_impl.super__Rb_tree_header._M_node_count);
        sVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208);
        pvVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208,
                             (ulong)dVar5 % sVar7);
        local_2cc = *pvVar10;
        local_2cd = de::Random::getBool((Random *)
                                        &tempMessageIds._M_t._M_impl.super__Rb_tree_header.
                                         _M_node_count);
        GVar3 = local_2cc;
        _itr = (pointer)0x0;
        puStack_310 = (pointer)0x0;
        local_308 = (pointer)0x0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&itr);
        MessageFilter::MessageFilter
                  (&local_300,0x1100,0x1100,GVar3,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&itr,(bool)(local_2cd & 1)
                  );
        std::
        vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
        ::push_back(__return_storage_ptr__,&local_300);
        MessageFilter::~MessageFilter(&local_300);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&itr);
      }
      else {
        sVar7 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
                ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
                        *)local_178);
        id._4_4_ = de::Random::getInt((Random *)
                                      &tempMessageIds._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count,0,(int)sVar7);
        for (id._0_4_ = 0; (int)id < 4; id._0_4_ = (int)id + 1) {
          iVar6 = id._4_4_ + (int)id;
          sVar7 = std::
                  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
                  ::size((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
                          *)local_178);
          pvStack_328 = std::
                        vector<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
                        ::operator[]((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
                                      *)local_178,(ulong)(long)iVar6 % sVar7);
          local_329 = de::Random::getBool((Random *)
                                          &tempMessageIds._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count);
          GVar3 = pvStack_328->source;
          type_ = pvStack_328->type;
          __value = &pvStack_328->id;
          std::allocator<unsigned_int>::allocator(&local_379);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&local_378,1,__value,&local_379);
          MessageFilter::MessageFilter
                    (&local_360,GVar3,type_,0x1100,&local_378,(bool)(local_329 & 1));
          std::
          vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
          ::push_back(__return_storage_ptr__,&local_360);
          MessageFilter::~MessageFilter(&local_360);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_378);
          std::allocator<unsigned_int>::~allocator(&local_379);
        }
      }
    }
    source._2_1_ = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_208);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1d8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1a8);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
               *)local_178);
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_100)
  ;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &tempSeverities._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &tempTypes._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
  ::~set((set<deqp::gles31::Functional::(anonymous_namespace)::MessageID,_std::less<deqp::gles31::Functional::(anonymous_namespace)::MessageID>,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageID>_>
          *)&tempSources._M_t._M_impl.super__Rb_tree_header._M_node_count);
  de::Random::~Random((Random *)&tempMessageIds._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return __return_storage_ptr__;
}

Assistant:

vector<FilterCase::MessageFilter> FilterCase::genFilters (const vector<MessageData>& messages, const vector<MessageFilter>& initial, deUint32 seed, int iterations) const
{
	de::Random				rng				(seed ^ deInt32Hash(deStringHash(getName())));

	set<MessageID>			tempMessageIds;
	set<GLenum>				tempSources;
	set<GLenum>				tempTypes;
	set<GLenum>				tempSeverities;

	if (messages.empty())
		return initial;

	for (int ndx = 0; ndx < int(messages.size()); ndx++)
	{
		const MessageData& msg = messages[ndx];

		tempMessageIds.insert(msg.id);
		tempSources.insert(msg.id.source);
		tempTypes.insert(msg.id.type);
		tempSeverities.insert(msg.severity);
	}

	{
		// Fetchable by index
		const vector<MessageID> messageIds	(tempMessageIds.begin(), tempMessageIds.end());
		const vector<GLenum>	sources		(tempSources.begin(), tempSources.end());
		const vector<GLenum>	types		(tempTypes.begin(), tempTypes.end());
		const vector<GLenum>	severities	(tempSeverities.begin(), tempSeverities.end());

		vector<MessageFilter>	filters		= initial;

		for (int iteration = 0; iteration < iterations; iteration++)
		{
			switch(rng.getInt(0, 8)) // Distribute so that per-message randomization (the default branch) is prevalent
			{
				case 0:
				{
					const GLenum	source	= sources[rng.getInt(0, int(sources.size()-1))];
					const bool		enabled	= rng.getBool();

					filters.push_back(MessageFilter(source, GL_DONT_CARE, GL_DONT_CARE, vector<GLuint>(), enabled));
					break;
				}

				case 1:
				{
					const GLenum	type	= types[rng.getUint32()%types.size()];
					const bool		enabled	= rng.getBool();

					filters.push_back(MessageFilter(GL_DONT_CARE, type, GL_DONT_CARE, vector<GLuint>(), enabled));
					break;
				}

				case 2:
				{
					const GLenum	severity	= severities[rng.getUint32()%severities.size()];
					const bool		enabled		= rng.getBool();

					filters.push_back(MessageFilter(GL_DONT_CARE, GL_DONT_CARE, severity, vector<GLuint>(), enabled));
					break;
				}

				default:
				{
					const int start = rng.getInt(0, int(messageIds.size()));

					for (int itr = 0; itr < 4; itr++)
					{
						const MessageID&	id		= messageIds[(start+itr)%messageIds.size()];
						const bool			enabled = rng.getBool();

						filters.push_back(MessageFilter(id.source, id.type, GL_DONT_CARE, vector<GLuint>(1, id.id), enabled));
					}
				}
			}
		}

		return filters;
	}
}